

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_bool32 ma_channel_map_is_blank(ma_channel *pChannelMap,ma_uint32 channels)

{
  uint local_20;
  ma_uint32 iChannel;
  ma_uint32 channels_local;
  ma_channel *pChannelMap_local;
  
  if (pChannelMap == (ma_channel *)0x0) {
    pChannelMap_local._4_4_ = 0;
  }
  else {
    for (local_20 = 0; local_20 < channels; local_20 = local_20 + 1) {
      if (pChannelMap[local_20] != '\0') {
        return 0;
      }
    }
    pChannelMap_local._4_4_ = 1;
  }
  return pChannelMap_local._4_4_;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_blank(const ma_channel* pChannelMap, ma_uint32 channels)
{
    ma_uint32 iChannel;

    /* A null channel map is equivalent to the default channel map. */
    if (pChannelMap == NULL) {
        return MA_FALSE;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (pChannelMap[iChannel] != MA_CHANNEL_NONE) {
            return MA_FALSE;
        }
    }

    return MA_TRUE;
}